

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.c
# Opt level: O0

int rc2_get_asn1_type_and_iv(EVP_CIPHER_CTX *c,ASN1_TYPE *type)

{
  uint max_len;
  int iVar1;
  int iVar2;
  ASN1_TYPE *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  uchar iv [16];
  uint l;
  int key_bits;
  int i;
  long num;
  EVP_CIPHER_CTX *in_stack_00000058;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  uint local_24;
  long local_20;
  ASN1_TYPE *local_18;
  EVP_CIPHER_CTX *local_10;
  
  local_20 = 0;
  local_24 = 0;
  if (in_RSI != (ASN1_TYPE *)0x0) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    max_len = EVP_CIPHER_CTX_get_iv_length(in_stack_00000058);
    if (0x10 < max_len) {
      OPENSSL_die(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    }
    local_24 = ASN1_TYPE_get_int_octetstring(local_18,&local_20,&stack0xffffffffffffffb8,max_len);
    if (local_24 != max_len) {
      return -1;
    }
    iVar1 = rc2_magic_to_meth(0x42ad2a);
    if (iVar1 == 0) {
      return -1;
    }
    if ((0 < (int)local_24) &&
       (iVar2 = EVP_CipherInit_ex(local_10,(EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)0x0,
                                  &stack0xffffffffffffffb8,-1), iVar2 == 0)) {
      return -1;
    }
    iVar2 = EVP_CIPHER_CTX_ctrl(local_10,3,iVar1,(void *)0x0);
    if ((iVar2 < 1) || (iVar1 = EVP_CIPHER_CTX_set_key_length(local_10,iVar1 / 8), iVar1 < 1)) {
      return -1;
    }
  }
  return local_24;
}

Assistant:

static int rc2_get_asn1_type_and_iv(EVP_CIPHER_CTX *c, ASN1_TYPE *type)
{
    long num = 0;
    int i = 0;
    int key_bits;
    unsigned int l;
    unsigned char iv[EVP_MAX_IV_LENGTH];

    if (type != NULL) {
        l = EVP_CIPHER_CTX_get_iv_length(c);
        OPENSSL_assert(l <= sizeof(iv));
        i = ASN1_TYPE_get_int_octetstring(type, &num, iv, l);
        if (i != (int)l)
            return -1;
        key_bits = rc2_magic_to_meth((int)num);
        if (!key_bits)
            return -1;
        if (i > 0 && !EVP_CipherInit_ex(c, NULL, NULL, NULL, iv, -1))
            return -1;
        if (EVP_CIPHER_CTX_ctrl(c, EVP_CTRL_SET_RC2_KEY_BITS, key_bits,
                                NULL) <= 0
                || EVP_CIPHER_CTX_set_key_length(c, key_bits / 8) <= 0)
            return -1;
    }
    return i;
}